

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

void __thiscall DisasmReplayer::DisasmReplayer(DisasmReplayer *this,VulkanDevice *device_)

{
  VkPipelineCacheCreateInfo info;
  VkPipelineCacheCreateInfo local_58;
  
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__DisasmReplayer_004b1558;
  this->device = device_;
  memset(&this->sampler_infos,0,0x120);
  (this->module_to_index)._M_h._M_buckets = &(this->module_to_index)._M_h._M_single_bucket;
  (this->module_to_index)._M_h._M_bucket_count = 1;
  (this->module_to_index)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->module_to_index)._M_h._M_element_count = 0;
  (this->module_to_index)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->module_to_index)._M_h._M_rehash_policy._M_next_resize,0,0xd8);
  (this->filter_graphics)._M_h._M_buckets = &(this->filter_graphics)._M_h._M_single_bucket;
  (this->filter_graphics)._M_h._M_bucket_count = 1;
  (this->filter_graphics)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->filter_graphics)._M_h._M_element_count = 0;
  (this->filter_graphics)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->filter_graphics)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->filter_graphics)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->filter_compute)._M_h._M_buckets = &(this->filter_compute)._M_h._M_single_bucket;
  (this->filter_compute)._M_h._M_bucket_count = 1;
  (this->filter_compute)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->filter_compute)._M_h._M_element_count = 0;
  (this->filter_compute)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->filter_compute)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->filter_compute)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->filter_raytracing)._M_h._M_buckets = &(this->filter_raytracing)._M_h._M_single_bucket;
  (this->filter_raytracing)._M_h._M_bucket_count = 1;
  (this->filter_raytracing)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->filter_raytracing)._M_h._M_element_count = 0;
  (this->filter_raytracing)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->filter_raytracing)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->filter_raytracing)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->filter_modules)._M_h._M_buckets = &(this->filter_modules)._M_h._M_single_bucket;
  (this->filter_modules)._M_h._M_bucket_count = 1;
  (this->filter_modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->filter_modules)._M_h._M_element_count = 0;
  (this->filter_modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->filter_modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->filter_modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (device_ != (VulkanDevice *)0x0) {
    local_58.pNext = (void *)0x0;
    local_58.flags = 0;
    local_58._20_4_ = 0;
    local_58.initialDataSize = 0;
    local_58.pInitialData = (void *)0x0;
    local_58.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
    local_58._4_4_ = 0;
    (*vkCreatePipelineCache)
              (device_->device,&local_58,(VkAllocationCallbacks *)0x0,&this->pipeline_cache);
  }
  return;
}

Assistant:

DisasmReplayer(VulkanDevice *device_)
		: device(device_)
	{
		if (device)
		{
			VkPipelineCacheCreateInfo info = { VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO };
			vkCreatePipelineCache(device->get_device(), &info, nullptr, &pipeline_cache);
		}
	}